

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# help_test.cpp
# Opt level: O1

int main(int param_1,char **param_2)

{
  testDefaultHelpOverride_HelpActive_ShouldFail();
  testDefaultHelpOverride_HelpNotActive_ShouldSucceed();
  testDefaultHelp_PrintToStream_ShouldSucceed();
  testDefaultHelp_ClearHelpText_ShouldSucceed();
  testDefaultHelp_SingleValueOptionAdded_ShouldSucceed();
  testSetGetHelpText_ShouldSucceed();
  return 0;
}

Assistant:

int main(int, char **)
{
    testDefaultHelpOverride_HelpActive_ShouldFail();

    testDefaultHelpOverride_HelpNotActive_ShouldSucceed();

    testDefaultHelp_PrintToStream_ShouldSucceed();

    testDefaultHelp_ClearHelpText_ShouldSucceed();

    testDefaultHelp_SingleValueOptionAdded_ShouldSucceed();

    testSetGetHelpText_ShouldSucceed();

    return EXIT_SUCCESS;
}